

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d *
tinyusdz::inverse_pxr(matrix4d *__return_storage_ptr__,matrix4d *m,double *detp,double eps)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 local_1e0 [136];
  double rcp;
  double det;
  double z33;
  double z32;
  double z23;
  double z22;
  double z13;
  double z12;
  double z03;
  double z02;
  double z31;
  double z21;
  double z11;
  double z01;
  double z30;
  double z20;
  double z10;
  double z00;
  double y23;
  double y13;
  double y12;
  double y03;
  double y02;
  double y01;
  double x33;
  double x32;
  double x31;
  double x30;
  double x23;
  double x22;
  double x21;
  double x20;
  double x13;
  double x12;
  double x11;
  double x10;
  double x03;
  double x02;
  double x01;
  double x00;
  double eps_local;
  double *detp_local;
  matrix4d *m_local;
  
  x01 = m->m[0][0];
  x02 = m->m[0][1];
  x11 = m->m[1][0];
  x12 = m->m[1][1];
  x21 = m->m[2][0];
  x22 = m->m[2][1];
  x31 = m->m[3][0];
  x32 = m->m[3][1];
  dVar2 = x01 * x12 + -(x11 * x02);
  dVar3 = x01 * x22 + -(x21 * x02);
  dVar4 = x01 * x32 + -(x31 * x02);
  dVar5 = x11 * x22 + -(x21 * x12);
  dVar6 = x11 * x32 + -(x31 * x12);
  dVar7 = x21 * x32 + -(x31 * x22);
  x03 = m->m[0][2];
  x10 = m->m[0][3];
  x13 = m->m[1][2];
  x20 = m->m[1][3];
  x23 = m->m[2][2];
  x30 = m->m[2][3];
  x33 = m->m[3][2];
  y01 = m->m[3][3];
  det = x23 * dVar2 + x03 * dVar5 + -(x13 * dVar3);
  z32 = -x03 * dVar6 + x13 * dVar4 + -(x33 * dVar2);
  z22 = x33 * dVar3 + x03 * dVar7 + -(x23 * dVar4);
  z12 = -x13 * dVar7 + x23 * dVar6 + -(x33 * dVar5);
  z33 = -x10 * dVar5 + x20 * dVar3 + -(x30 * dVar2);
  z23 = y01 * dVar2 + x10 * dVar6 + -(x20 * dVar4);
  z13 = -x10 * dVar7 + x30 * dVar4 + -(y01 * dVar3);
  z03 = y01 * dVar5 + x20 * dVar7 + -(x30 * dVar6);
  y02 = x03 * x20 + -(x13 * x10);
  y03 = x03 * x30 + -(x23 * x10);
  y12 = x03 * y01 + -(x33 * x10);
  y13 = x13 * x30 + -(x23 * x20);
  y23 = x13 * y01 + -(x33 * x20);
  z00 = x23 * y01 + -(x33 * x30);
  z01 = -x02 * y13 + x12 * y03 + -(x22 * y02);
  z30 = x32 * y02 + x02 * y23 + -(x12 * y12);
  z20 = -x02 * z00 + x22 * y12 + -(x32 * y03);
  z10 = x32 * y13 + x12 * z00 + -(x22 * y23);
  z02 = x21 * y02 + x01 * y13 + -(x11 * y03);
  z31 = -x01 * y23 + x11 * y12 + -(x31 * y02);
  z21 = x31 * y03 + x01 * z00 + -(x21 * y12);
  z11 = -x11 * z00 + x21 * y23 + -(x31 * y13);
  rcp = x01 * z10 + x11 * z20 + x31 * z01 + x21 * z30;
  if (detp != (double *)0x0) {
    *detp = rcp;
  }
  x00 = eps;
  eps_local = (double)detp;
  detp_local = (double *)m;
  value::matrix4d::matrix4d(__return_storage_ptr__);
  if (ABS(rcp) <= x00) {
    value::matrix4d::identity();
    memcpy(__return_storage_ptr__,local_1e0,0x80);
    fVar1 = ::std::numeric_limits<float>::max();
    __return_storage_ptr__->m[0][0] = (double)fVar1;
    fVar1 = ::std::numeric_limits<float>::max();
    __return_storage_ptr__->m[1][1] = (double)fVar1;
    fVar1 = ::std::numeric_limits<float>::max();
    __return_storage_ptr__->m[2][2] = (double)fVar1;
  }
  else {
    dVar2 = 1.0 / rcp;
    __return_storage_ptr__->m[0][0] = z10 * dVar2;
    __return_storage_ptr__->m[0][1] = z20 * dVar2;
    __return_storage_ptr__->m[1][0] = z11 * dVar2;
    __return_storage_ptr__->m[0][2] = z30 * dVar2;
    __return_storage_ptr__->m[2][0] = z03 * dVar2;
    __return_storage_ptr__->m[0][3] = z01 * dVar2;
    __return_storage_ptr__->m[3][0] = z12 * dVar2;
    __return_storage_ptr__->m[1][1] = z21 * dVar2;
    __return_storage_ptr__->m[1][2] = z31 * dVar2;
    __return_storage_ptr__->m[2][1] = z13 * dVar2;
    __return_storage_ptr__->m[1][3] = z02 * dVar2;
    __return_storage_ptr__->m[3][1] = z22 * dVar2;
    __return_storage_ptr__->m[2][2] = z23 * dVar2;
    __return_storage_ptr__->m[2][3] = z33 * dVar2;
    __return_storage_ptr__->m[3][2] = z32 * dVar2;
    __return_storage_ptr__->m[3][3] = det * dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d inverse_pxr(const value::matrix4d &m, double *detp,
                            double eps) {
  double x00, x01, x02, x03;
  double x10, x11, x12, x13;
  double x20, x21, x22, x23;
  double x30, x31, x32, x33;
  double y01, y02, y03, y12, y13, y23;
  double z00, z10, z20, z30;
  double z01, z11, z21, z31;
  double z02, z03, z12, z13, z22, z23, z32, z33;

  // Pickle 1st two columns of matrix into registers
  x00 = m.m[0][0];
  x01 = m.m[0][1];
  x10 = m.m[1][0];
  x11 = m.m[1][1];
  x20 = m.m[2][0];
  x21 = m.m[2][1];
  x30 = m.m[3][0];
  x31 = m.m[3][1];

  // Compute all six 2x2 determinants of 1st two columns
  y01 = x00 * x11 - x10 * x01;
  y02 = x00 * x21 - x20 * x01;
  y03 = x00 * x31 - x30 * x01;
  y12 = x10 * x21 - x20 * x11;
  y13 = x10 * x31 - x30 * x11;
  y23 = x20 * x31 - x30 * x21;

  // Pickle 2nd two columns of matrix into registers
  x02 = m.m[0][2];
  x03 = m.m[0][3];
  x12 = m.m[1][2];
  x13 = m.m[1][3];
  x22 = m.m[2][2];
  x23 = m.m[2][3];
  x32 = m.m[3][2];
  x33 = m.m[3][3];

  // Compute all 3x3 cofactors for 2nd two columns */
  z33 = x02 * y12 - x12 * y02 + x22 * y01;
  z23 = x12 * y03 - x32 * y01 - x02 * y13;
  z13 = x02 * y23 - x22 * y03 + x32 * y02;
  z03 = x22 * y13 - x32 * y12 - x12 * y23;
  z32 = x13 * y02 - x23 * y01 - x03 * y12;
  z22 = x03 * y13 - x13 * y03 + x33 * y01;
  z12 = x23 * y03 - x33 * y02 - x03 * y23;
  z02 = x13 * y23 - x23 * y13 + x33 * y12;

  // Compute all six 2x2 determinants of 2nd two columns
  y01 = x02 * x13 - x12 * x03;
  y02 = x02 * x23 - x22 * x03;
  y03 = x02 * x33 - x32 * x03;
  y12 = x12 * x23 - x22 * x13;
  y13 = x12 * x33 - x32 * x13;
  y23 = x22 * x33 - x32 * x23;

  // Compute all 3x3 cofactors for 1st two columns
  z30 = x11 * y02 - x21 * y01 - x01 * y12;
  z20 = x01 * y13 - x11 * y03 + x31 * y01;
  z10 = x21 * y03 - x31 * y02 - x01 * y23;
  z00 = x11 * y23 - x21 * y13 + x31 * y12;
  z31 = x00 * y12 - x10 * y02 + x20 * y01;
  z21 = x10 * y03 - x30 * y01 - x00 * y13;
  z11 = x00 * y23 - x20 * y03 + x30 * y02;
  z01 = x20 * y13 - x30 * y12 - x10 * y23;

  // compute 4x4 determinant & its reciprocal
  double det = x30 * z30 + x20 * z20 + x10 * z10 + x00 * z00;
  if (detp) {
    *detp = det;
  }

  value::matrix4d inv;

  if (std::fabs(det) > eps) {
    double rcp = 1.0 / det;
    // Multiply all 3x3 cofactors by reciprocal & transpose
    inv.m[0][0] = z00 * rcp;
    inv.m[0][1] = z10 * rcp;
    inv.m[1][0] = z01 * rcp;
    inv.m[0][2] = z20 * rcp;
    inv.m[2][0] = z02 * rcp;
    inv.m[0][3] = z30 * rcp;
    inv.m[3][0] = z03 * rcp;
    inv.m[1][1] = z11 * rcp;
    inv.m[1][2] = z21 * rcp;
    inv.m[2][1] = z12 * rcp;
    inv.m[1][3] = z31 * rcp;
    inv.m[3][1] = z13 * rcp;
    inv.m[2][2] = z22 * rcp;
    inv.m[2][3] = z32 * rcp;
    inv.m[3][2] = z23 * rcp;
    inv.m[3][3] = z33 * rcp;

  } else {
    inv = value::matrix4d::identity();
    // scale = FLT_MAX
    inv.m[0][0] = double((std::numeric_limits<float>::max)());
    inv.m[1][1] = double((std::numeric_limits<float>::max)());
    inv.m[2][2] = double((std::numeric_limits<float>::max)());
    // [3][3] = 1.0
  }

  return inv;
}